

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::traceMsgInternal(QMakeEvaluator *this,char *fmt,...)

{
  ProFile *pPVar1;
  FILE *__stream;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char> local_60;
  undefined8 local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  __stream = _stderr;
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Da;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (undefined1 *)0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  puStack_40 = (undefined1 *)0xaaaaaaaaaaaaaaaa;
  pPVar1 = (this->m_current).pro;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  if (pPVar1 == (ProFile *)0x0) {
    fwrite("DEBUG 1: ",9,1,_stderr);
  }
  else {
    if ((this->m_current).line == 0) {
      local_78.d = (pPVar1->m_fileName).d.d;
      local_78.ptr = (pPVar1->m_fileName).d.ptr;
      local_78.size = (pPVar1->m_fileName).d.size;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::toLocal8Bit((QByteArray *)&local_60,(QString *)&local_78);
      if (local_60.ptr == (char *)0x0) {
        local_60.ptr = (char *)&QByteArray::_empty;
      }
      fprintf(__stream,"DEBUG 1: %s: ",local_60.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    }
    else {
      local_78.d = (pPVar1->m_fileName).d.d;
      local_78.ptr = (pPVar1->m_fileName).d.ptr;
      local_78.size = (pPVar1->m_fileName).d.size;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::toLocal8Bit((QByteArray *)&local_60,(QString *)&local_78);
      if (local_60.ptr == (char *)0x0) {
        local_60.ptr = (char *)&QByteArray::_empty;
      }
      fprintf(__stream,"DEBUG 1: %s:%d: ",local_60.ptr,(ulong)(this->m_current).line);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  puStack_40 = &stack0x00000008;
  local_48 = 0x3000000010;
  local_38 = auStack_128;
  __vfprintf_chk(_stderr,1,fmt);
  fputc(10,_stderr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::traceMsgInternal(const char *fmt, ...) const
{
    va_list ap;

    if (!m_current.pro)
        fprintf(stderr, "DEBUG 1: ");
    else if (m_current.line <= 0)
        fprintf(stderr, "DEBUG 1: %s: ", qPrintable(m_current.pro->fileName()));
    else
        fprintf(stderr, "DEBUG 1: %s:%d: ", qPrintable(m_current.pro->fileName()), m_current.line);
    va_start(ap, fmt);
    vfprintf(stderr, fmt, ap);
    va_end(ap);
    fputc('\n', stderr);
}